

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  action_e action;
  Pl_Base64 decode;
  Pl_OStream out;
  Pl_Base64 local_90;
  Pl_OStream local_48;
  
  if (argc == 2) {
    QUtil::binary_stdout();
    QUtil::binary_stdin();
    __s1 = argv[1];
    iVar2 = strcmp(__s1,"encode");
    if (iVar2 != 0) {
      iVar2 = strcmp(__s1,"decode");
      action = a_decode;
      if (iVar2 == 0) goto LAB_0011d48e;
      goto LAB_0011d487;
    }
  }
  else {
LAB_0011d487:
    usage();
  }
  action = a_encode;
LAB_0011d48e:
  Pl_OStream::Pl_OStream(&local_48,"stdout",(ostream *)&std::cout);
  Pl_Base64::Pl_Base64(&local_90,"decode",&local_48.super_Pipeline,action);
  bVar1 = write_some(_stdin,1,&local_90.super_Pipeline);
  if (bVar1) {
    bVar1 = write_some(_stdin,4,&local_90.super_Pipeline);
    if (bVar1) {
      bVar1 = write_some(_stdin,2,&local_90.super_Pipeline);
      if (bVar1) {
        bVar1 = write_some(_stdin,2,&local_90.super_Pipeline);
        if (bVar1) {
          bVar1 = write_some(_stdin,7,&local_90.super_Pipeline);
          if (bVar1) {
            bVar1 = write_some(_stdin,1,&local_90.super_Pipeline);
            if (bVar1) {
              bVar1 = write_some(_stdin,9,&local_90.super_Pipeline);
              if (bVar1) {
                bVar1 = write_some(_stdin,2,&local_90.super_Pipeline);
                if (bVar1) {
                  do {
                    bVar1 = write_some(_stdin,1000,&local_90.super_Pipeline);
                  } while (bVar1);
                }
              }
            }
          }
        }
      }
    }
  }
  local_90.super_Pipeline._vptr_Pipeline = (_func_int **)&PTR__Pipeline_002edaa0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.super_Pipeline.identifier._M_dataplus._M_p !=
      &local_90.super_Pipeline.identifier.field_2) {
    operator_delete(local_90.super_Pipeline.identifier._M_dataplus._M_p,
                    local_90.super_Pipeline.identifier.field_2._M_allocated_capacity + 1);
  }
  Pl_OStream::~Pl_OStream(&local_48);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    if (argc != 2) {
        usage();
    }
    QUtil::binary_stdout();
    QUtil::binary_stdin();
    Pl_Base64::action_e action = Pl_Base64::a_decode;
    if (strcmp(argv[1], "encode") == 0) {
        action = Pl_Base64::a_encode;
    } else if (strcmp(argv[1], "decode") != 0) {
        usage();
    }

    try {
        Pl_OStream out("stdout", std::cout);
        Pl_Base64 decode("decode", &out, action);
        // The comments are "n: n%4 n%3", where n is the number of
        // bytes read at the end of the call, and are there to
        // indicate that we are reading in chunks that exercise
        // various boundary conditions around subsequent writes and
        // the state of buf and pos. There are some writes that don't
        // do flush at all, some that call flush multiple times, and
        // some that start in the middle and do flush, and this is
        // true for both encode and decode.
        if (write_some(stdin, 1, &decode) && //  1: 1 1
            write_some(stdin, 4, &decode) && //  5: 1 2
            write_some(stdin, 2, &decode) && //  7: 3 1
            write_some(stdin, 2, &decode) && //  9: 1 0
            write_some(stdin, 7, &decode) && // 16: 0 1
            write_some(stdin, 1, &decode) && // 17: 1 2
            write_some(stdin, 9, &decode) && // 26: 2 2
            write_some(stdin, 2, &decode)) { // 28: 0 1
            while (write_some(stdin, 1000, &decode)) {
            }
        }
    } catch (std::exception& e) {
        std::cout << "exception: " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}